

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

void Pdr_ManDumpClauses(Pdr_Man_t *p,char *pFileName,int fProved)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  Vec_Ptr_t *vCubes;
  void **ppvVar6;
  Vec_Int_t *vFlopCounts;
  Abc_Frame_t *p_00;
  Abc_Ntk_t *pNtk;
  char **__ptr;
  Aig_Man_t *pAVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  
  pcVar10 = pFileName;
  __stream = fopen(pFileName,"w");
  iVar4 = (int)pcVar10;
  if (__stream == (FILE *)0x0) {
    pcVar10 = "Cannot open file \"%s\" for writing invariant.\n";
  }
  else {
    iVar4 = Pdr_ManFindInvariantStart(p);
    if (fProved == 0) {
      pVVar3 = p->vInfCubes;
      vCubes = (Vec_Ptr_t *)malloc(0x10);
      iVar1 = pVVar3->nSize;
      vCubes->nSize = iVar1;
      iVar2 = pVVar3->nCap;
      vCubes->nCap = iVar2;
      if ((long)iVar2 == 0) {
        ppvVar6 = (void **)0x0;
      }
      else {
        ppvVar6 = (void **)malloc((long)iVar2 << 3);
      }
      vCubes->pArray = ppvVar6;
      memcpy(ppvVar6,pVVar3->pArray,(long)iVar1 << 3);
    }
    else {
      vCubes = Pdr_ManCollectCubes(p,iVar4);
    }
    if (1 < (long)vCubes->nSize) {
      qsort(vCubes->pArray,(long)vCubes->nSize,8,Pdr_SetCompare);
    }
    if ((long)vCubes->nSize < 1) {
      uVar9 = 0;
    }
    else {
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar9 = uVar9 + (*(int *)((long)vCubes->pArray[lVar8] + 8) != -1);
        lVar8 = lVar8 + 1;
      } while (vCubes->nSize != lVar8);
    }
    vFlopCounts = Pdr_ManCountFlops(p,vCubes);
    pcVar10 = "# Inductive invariant for \"%s\"\n";
    if (fProved == 0) {
      pcVar10 = "# Clauses of the last timeframe for \"%s\"\n";
    }
    fprintf(__stream,pcVar10,p->pAig->pName);
    pcVar10 = Aig_TimeStamp();
    fprintf(__stream,"# generated by PDR in ABC on %s\n",pcVar10);
    uVar5 = Pdr_ManCountVariables(p,iVar4);
    fprintf(__stream,".i %d\n",(ulong)uVar5);
    fwrite(".o 1\n",5,1,__stream);
    fprintf(__stream,".p %d\n",(ulong)uVar9);
    p_00 = Abc_FrameReadGlobalFrame();
    pNtk = Abc_FrameReadNtk(p_00);
    __ptr = Abc_NtkCollectCioNames(pNtk,0);
    if (__ptr != (char **)0x0) {
      fwrite(".ilb",4,1,__stream);
      pAVar7 = p->pAig;
      if (0 < pAVar7->nRegs) {
        lVar8 = 0;
        do {
          if (vFlopCounts->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vFlopCounts->pArray[lVar8] != 0) {
            fprintf(__stream," %s",__ptr[pAVar7->nTruePis + lVar8]);
          }
          lVar8 = lVar8 + 1;
          pAVar7 = p->pAig;
        } while (lVar8 < pAVar7->nRegs);
      }
      fputc(10,__stream);
      free(__ptr);
      fwrite(".ob inv\n",8,1,__stream);
    }
    if (0 < vCubes->nSize) {
      lVar8 = 0;
      do {
        if (((Pdr_Set_t *)vCubes->pArray[lVar8])->nRefs != -1) {
          Pdr_SetPrint((FILE *)__stream,(Pdr_Set_t *)vCubes->pArray[lVar8],p->pAig->nRegs,
                       vFlopCounts);
          fwrite(" 1\n",3,1,__stream);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vCubes->nSize);
    }
    fwrite(".e\n\n",4,1,__stream);
    fclose(__stream);
    if (vFlopCounts != (Vec_Int_t *)0x0) {
      if (vFlopCounts->pArray != (int *)0x0) {
        free(vFlopCounts->pArray);
        vFlopCounts->pArray = (int *)0x0;
      }
      free(vFlopCounts);
    }
    ppvVar6 = vCubes->pArray;
    if (ppvVar6 != (void **)0x0) {
      free(ppvVar6);
      vCubes->pArray = (void **)0x0;
    }
    iVar4 = (int)ppvVar6;
    if (vCubes != (Vec_Ptr_t *)0x0) {
      free(vCubes);
      iVar4 = (int)vCubes;
    }
    pcVar10 = "Inductive invariant was written into file \"%s\".\n";
    if (fProved == 0) {
      pcVar10 = "Clauses of the last timeframe were written into file \"%s\".\n";
    }
  }
  Abc_Print(iVar4,pcVar10,pFileName);
  return;
}

Assistant:

void Pdr_ManDumpClauses( Pdr_Man_t * p, char * pFileName, int fProved )
{
    int fUseSupp = 1;
    FILE * pFile;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    char ** pNamesCi;
    int i, kStart, Count = 0;
    // create file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file \"%s\" for writing invariant.\n", pFileName );
        return;
    } 
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( fProved )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
//    Pdr_ManDumpAig( p->pAig, vCubes );
    // count cubes
    Count = 0;
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Count++;
    }
    // collect variable appearances
    vFlopCounts = fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output the header
    if ( fProved )
        fprintf( pFile, "# Inductive invariant for \"%s\"\n", p->pAig->pName );
    else
        fprintf( pFile, "# Clauses of the last timeframe for \"%s\"\n", p->pAig->pName );
    fprintf( pFile, "# generated by PDR in ABC on %s\n", Aig_TimeStamp() );
    fprintf( pFile, ".i %d\n", fUseSupp ? Pdr_ManCountVariables(p, kStart) : Aig_ManRegNum(p->pAig) );
    fprintf( pFile, ".o 1\n" );
    fprintf( pFile, ".p %d\n", Count );
    // output flop names
    pNamesCi = Abc_NtkCollectCioNames( Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() ), 0 );
    if ( pNamesCi )
    {
        fprintf( pFile, ".ilb" );
        for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
            if ( !fUseSupp || Vec_IntEntry( vFlopCounts, i ) )
                fprintf( pFile, " %s", pNamesCi[Saig_ManPiNum(p->pAig) + i] );
        fprintf( pFile, "\n" );
        ABC_FREE( pNamesCi );
        fprintf( pFile, ".ob inv\n" );
    }
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrint( pFile, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
        fprintf( pFile, " 1\n" ); 
    }
    fprintf( pFile, ".e\n\n" );
    fclose( pFile );
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    if ( fProved )
        Abc_Print( 1, "Inductive invariant was written into file \"%s\".\n", pFileName );
    else
        Abc_Print( 1, "Clauses of the last timeframe were written into file \"%s\".\n", pFileName );
}